

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::print(Board *this,uint moves)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint __val;
  uint uVar4;
  ostream *poVar5;
  byte *pbVar6;
  long *plVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  uint __uval;
  string __str;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  ulong local_88;
  long local_80;
  string local_78;
  string local_58;
  ulong local_38;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"--= Board =--",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  if (this->m_height != '\0') {
    bVar11 = 0;
    do {
      print_index(bVar11);
      bVar11 = bVar11 + 1;
    } while (bVar11 < this->m_height);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (this->m_width != '\0') {
    uVar8 = 99;
    if ((int)moves < 99) {
      uVar8 = (ulong)moves;
    }
    uVar9 = (uint)uVar8;
    __val = -uVar9;
    if (0 < (int)uVar9) {
      __val = uVar9;
    }
    uVar8 = uVar8 >> 0x1f;
    uVar10 = 0;
    local_38 = uVar8;
    do {
      local_88 = uVar10;
      print_index((dimension)uVar10);
      if (this->m_height != '\0') {
        local_80 = local_88 * 3;
        uVar10 = 0;
        do {
          if (*(char *)(*(long *)((long)&(((this->m_board).
                                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data + local_80 * 8) + uVar10)
              == 'j') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\x1b[1mJK\x1b[0m",10);
          }
          else {
            bVar11 = (this->m_position).first;
            bVar1 = (this->m_position).second;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[",2);
            if ((local_88 == bVar11) && (uVar10 == bVar1)) {
              pbVar6 = std::
                       map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                       ::at(&color_codes,
                            (key_type *)
                            (*(long *)((long)&(((this->m_board).
                                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data + local_80 * 8) +
                            uVar10));
              bVar11 = *pbVar6;
              uVar9 = 3 - (bVar11 < 0x46);
              local_a8 = local_98;
              std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar9);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a8,uVar9,bVar11 + 0x1e);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_a8,local_a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"m",1);
              uVar9 = 1;
              if (9 < __val) {
                uVar4 = __val;
                uVar3 = 4;
                do {
                  uVar9 = uVar3;
                  if (uVar4 < 100) {
                    uVar9 = uVar9 - 2;
                    goto LAB_00103ab6;
                  }
                  if (uVar4 < 1000) {
                    uVar9 = uVar9 - 1;
                    goto LAB_00103ab6;
                  }
                  if (uVar4 < 10000) goto LAB_00103ab6;
                  bVar2 = 99999 < uVar4;
                  uVar4 = uVar4 / 10000;
                  uVar3 = uVar9 + 4;
                } while (bVar2);
                uVar9 = uVar9 + 1;
              }
LAB_00103ab6:
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar8 + (char)uVar9);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_78._M_dataplus._M_p + uVar8,uVar9,__val);
              zfill(&local_58,&local_78,2,'0');
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              pbVar6 = std::
                       map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                       ::at(&color_codes,
                            (key_type *)
                            (*(long *)((long)&(((this->m_board).
                                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data + local_80 * 8) +
                            uVar10));
              bVar11 = *pbVar6;
              uVar9 = 3 - (bVar11 < 0x3c);
              local_a8 = local_98;
              std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar9);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a8,uVar9,bVar11 + 0x28);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_a8,local_a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"m  \x1b[0m",7);
            }
            if (local_a8 != local_98) {
              operator_delete(local_a8,local_98[0] + 1);
            }
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < this->m_height);
      }
      uVar10 = local_88;
      print_index((dimension)local_88);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      uVar10 = uVar10 + 1;
    } while (uVar10 < this->m_width);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  if (this->m_height != '\0') {
    bVar11 = 0;
    do {
      print_index(bVar11);
      bVar11 = bVar11 + 1;
    } while (bVar11 < this->m_height);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar7 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  return;
}

Assistant:

void Board::print(const unsigned int moves) const {
    // Display title.
    cout << endl << "--= Board =--" << endl;

    // Display upper indexes (X axis).
    cout << "  ";
    for (dimension y = 0; y < m_height; y++) print_index(y);
    cout << endl;

    // Display board.
    for (dimension x = 0; x < m_width; x++) {
        // Display left index (Y axis).
        print_index(x);
        for (dimension y = 0; y < m_height; y++) {
            if (m_board[x][y] == joker) {
                // Display joker.
                cout << "\033[1mJK\033[0m";
            } else if ((x == m_position.first) && (y == m_position.second)) {
                // Display base position.
                cout << "\033[" << to_string(color_codes.at(m_board[x][y]) + foreground_color_code) << "m"
                     << zfill(to_string(min((int) moves, 99)), 2, '0') << "\033[0m";
            } else {
                // Display color.
                cout << "\033[" << to_string(color_codes.at(m_board[x][y]) + background_color_code) << "m  \033[0m";
            }
        }
        // Display right index (Y axis).
        print_index(x);
        cout << endl;
    }

    // Display lower indexes (X axis).
    cout << "  ";
    for (dimension y = 0; y < m_height; y++) print_index(y);
    cout << endl << endl;
}